

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O3

bool Refal2::CInternalProgramBuilder::Check(CModuleDataVector *modules,CErrorsHelper *errors)

{
  bool bVar1;
  bool bVar2;
  pointer __pos;
  CInternalProgramBuilder builder;
  CInternalProgramBuilder CStack_78;
  
  bVar1 = CErrorsHelper::HasErrors(errors);
  __pos = (modules->
          super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  bVar2 = false;
  if ((!bVar1) &&
     (bVar2 = false,
     __pos != (modules->
              super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish)) {
    CInternalProgramBuilder(&CStack_78,errors);
    processModules(&CStack_78,modules,0x129212);
    bVar2 = CErrorsHelper::HasErrors(errors);
    if (bVar2) {
      bVar2 = false;
    }
    else {
      check(&CStack_78);
      bVar2 = CErrorsHelper::HasErrors(errors);
      bVar2 = !bVar2;
    }
    if (CStack_78.program.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (CStack_78.program.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    CDictionary<Refal2::CGlobalFunctionData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~CDictionary(&CStack_78.globals);
    __pos = (modules->
            super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  }
  std::
  vector<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
  ::_M_erase_at_end(modules,__pos);
  return bVar2;
}

Assistant:

bool CInternalProgramBuilder::Check( CModuleDataVector& modules,
	CErrorsHelper& errors )
{
	bool result = false;
	if( !errors.HasErrors() && !modules.empty() ) {
		CInternalProgramBuilder builder( errors );
		builder.collect( modules );
		if( !errors.HasErrors() ) {
			builder.check();
			result = !errors.HasErrors();
		}
	}
	modules.clear();
	return result;
}